

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  ushort uVar1;
  ulong uVar2;
  pointer paVar3;
  handle hVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _Bit_pointer puVar7;
  pointer pfVar8;
  handle hVar9;
  function_record *pfVar10;
  long lVar11;
  PyObject *pPVar12;
  type_info *ptVar13;
  _Bit_type *p_Var14;
  type_error *this;
  byte bVar15;
  argument_record aVar16;
  long lVar17;
  _Bit_type *p_Var18;
  int __val;
  long lVar19;
  size_type __new_size;
  char *pcVar20;
  char cVar21;
  bool bVar22;
  PyObject *pPVar23;
  iterator __begin3;
  ulong uVar24;
  size_t size;
  ulong uVar25;
  pointer pfVar26;
  ulong uVar27;
  size_t sVar28;
  PyObject *pPVar29;
  bool bVar30;
  bool bVar31;
  reference rVar32;
  handle value;
  handle hStack_1a0;
  object oStack_190;
  _Bit_pointer local_188;
  function_record *local_180;
  handle local_178;
  allocator local_16a;
  allocator local_169;
  vector<bool,_std::allocator<bool>_> second_pass_convert;
  dict kwargs;
  PyObject *local_120;
  tuple extra_args;
  handle local_e0;
  string msg;
  undefined1 local_b8 [16];
  _Bit_type *local_a8;
  handle hStack_a0;
  _Bit_pointer local_98;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_178.m_ptr = kwargs_in;
  pfVar10 = (function_record *)PyCapsule_GetPointer(self,0);
  local_180 = pfVar10;
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                  ,0x189,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  uVar2 = args_in[1].ob_refcnt;
  if (uVar2 == 0) {
    local_e0.m_ptr = (PyObject *)0x0;
  }
  else {
    local_e0.m_ptr = (PyObject *)args_in[1].ob_type;
  }
  second_pass.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  second_pass.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  second_pass.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pfVar10 == (function_record *)0x0) {
    bVar31 = false;
  }
  else {
    bVar31 = pfVar10->next != (function_record *)0x0;
  }
  local_120 = (PyObject *)0x1;
  for (; pfVar10 != (function_record *)0x0; pfVar10 = pfVar10->next) {
    uVar1 = pfVar10->nargs;
    bVar15 = (pfVar10->field_0x59 & 8) >> 3;
    lVar19 = (long)((char)(pfVar10->field_0x59 << 3) >> 7);
    uVar24 = ((ulong)uVar1 - (ulong)bVar15) + lVar19;
    if (((bVar15 != 0) || (uVar2 <= uVar24)) &&
       ((uVar24 <= uVar2 ||
        (uVar24 <= (ulong)((long)(pfVar10->args).
                                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pfVar10->args).
                                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5))))) {
      detail::function_call::function_call((function_call *)&msg,pfVar10,local_e0);
      uVar25 = uVar24;
      if (uVar2 < uVar24) {
        uVar25 = uVar2;
      }
      lVar17 = 0;
      for (uVar27 = 0; uVar25 != uVar27; uVar27 = uVar27 + 1) {
        if ((((local_178.m_ptr != (PyObject *)0x0) &&
             (paVar3 = (pfVar10->args).
                       super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             uVar27 < (ulong)((long)(pfVar10->args).
                                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 5))
             ) && (*(long *)(paVar3 + lVar17) != 0)) &&
           (lVar11 = PyDict_GetItemString(local_178.m_ptr), lVar11 != 0)) {
          this = (type_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string((string *)&extra_args,pfVar10->name,&local_169);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &kwargs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&extra_args,"(): got multiple values for argument \'");
          std::__cxx11::string::string
                    ((string *)&local_50,
                     *(char **)((pfVar10->args).
                                super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar17),&local_16a);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &second_pass_convert,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &kwargs,&local_50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &second_pass_convert,"\'");
          type_error::runtime_error(this,(string *)&value);
          __cxa_throw(this,&type_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                        ,0x1ca,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        value.m_ptr = (PyObject *)(&args_in[1].ob_type)[uVar27];
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::
        emplace_back<pybind11::handle>
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                   &msg._M_string_length,&value);
        paVar3 = (pfVar10->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        aVar16 = (argument_record)0x1;
        if (uVar27 < (ulong)((long)(pfVar10->args).
                                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 5))
        {
          aVar16 = paVar3[lVar17 + 0x18];
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)local_b8,(bool)((byte)aVar16 & 1));
        lVar17 = lVar17 + 0x20;
      }
      kwargs.super_object.super_handle.m_ptr = (object)(object)local_178.m_ptr;
      if (local_178.m_ptr != (PyObject *)0x0) {
        (local_178.m_ptr)->ob_refcnt = (local_178.m_ptr)->ob_refcnt + 1;
      }
      uVar27 = uVar25;
      if (uVar2 < uVar24) {
        lVar17 = ((lVar19 - (ulong)bVar15) + (ulong)uVar1) - uVar25;
        lVar19 = uVar25 << 5;
        bVar22 = false;
        while (bVar30 = lVar17 != 0, lVar17 = lVar17 + -1, uVar27 = uVar24, bVar30) {
          paVar3 = (pfVar10->args).
                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          value.m_ptr = (PyObject *)0x0;
          if (((local_178.m_ptr == (PyObject *)0x0) || (*(long *)(paVar3 + lVar19) == 0)) ||
             (value.m_ptr = (PyObject *)PyDict_GetItemString(kwargs.super_object.super_handle.m_ptr)
             , value.m_ptr == (PyObject *)0x0)) {
            hVar9.m_ptr = *(PyObject **)(paVar3 + lVar19 + 0x10);
            hVar4.m_ptr = value.m_ptr;
          }
          else {
            if (!bVar22) {
              second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                   (_Bit_type *)PyDict_Copy(kwargs.super_object.super_handle.m_ptr);
              pybind11::object::operator=(&kwargs.super_object,(object *)&second_pass_convert);
              pybind11::object::~object((object *)&second_pass_convert);
            }
            PyDict_DelItemString
                      (kwargs.super_object.super_handle.m_ptr,*(undefined8 *)(paVar3 + lVar19));
            bVar22 = true;
            hVar9 = value;
            hVar4 = value;
          }
          value.m_ptr = hVar9.m_ptr;
          if (value.m_ptr == (PyObject *)0x0) {
            bVar22 = false;
            value.m_ptr = hVar4.m_ptr;
            goto LAB_0046cad0;
          }
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                     &msg._M_string_length,&value);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_b8,
                     (bool)((byte)paVar3[lVar19 + 0x18] & 1));
          lVar19 = lVar19 + 0x20;
        }
      }
      if ((((handle)kwargs.super_object.super_handle.m_ptr == (handle)0x0) ||
          (lVar19 = PyDict_Size(), lVar19 == 0)) || ((pfVar10->field_0x59 & 0x10) != 0)) {
        tuple::tuple(&extra_args,0);
        bVar15 = pfVar10->field_0x59;
        if ((bVar15 & 8) != 0) {
          if (uVar25 == 0) {
            args_in->ob_refcnt = args_in->ob_refcnt + 1;
            value.m_ptr = args_in;
LAB_0046c88e:
            pybind11::object::operator=(&extra_args.super_object,(object *)&value);
            pybind11::object::~object((object *)&value);
          }
          else {
            size = uVar2 - uVar27;
            if (uVar2 < uVar27 || size == 0) {
              tuple::tuple((tuple *)&value,0);
              goto LAB_0046c88e;
            }
            tuple::tuple((tuple *)&value,size);
            pybind11::object::operator=(&extra_args.super_object,(object *)&value);
            pybind11::object::~object((object *)&value);
            for (sVar28 = 0; size != sVar28; sVar28 = sVar28 + 1) {
              if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                              ,0x204,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                   (_Bit_type *)(&args_in[1].ob_type)[uVar27 + sVar28];
              if ((PyTypeObject *)
                  second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  (PyTypeObject *)0x0) {
                (((PyTypeObject *)
                 second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->ob_base).ob_base.
                ob_refcnt = (((PyTypeObject *)
                             second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->
                            ob_base).ob_base.ob_refcnt + 1;
              }
              hStack_1a0.m_ptr = (PyObject *)extra_args.super_object.super_handle.m_ptr;
              oStack_190.super_handle.m_ptr = (handle)(PyObject *)0x0;
              detail::accessor<pybind11::detail::accessor_policies::tuple_item>::operator=
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&value,
                         (_object **)&second_pass_convert);
              pybind11::object::~object(&oStack_190);
            }
          }
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                     &msg._M_string_length,(value_type *)&extra_args);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_b8,false);
          bVar15 = pfVar10->field_0x59;
        }
        if ((bVar15 & 0x10) != 0) {
          if ((handle)kwargs.super_object.super_handle.m_ptr == (handle)0x0) {
            dict::dict((dict *)&value);
            pybind11::object::operator=(&kwargs.super_object,(object *)&value);
            pybind11::object::~object((object *)&value);
          }
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                     &msg._M_string_length,(value_type *)&kwargs);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_b8,false);
        }
        __new_size = (long)(msg.field_2._M_allocated_capacity - msg._M_string_length) >> 3;
        if ((__new_size != pfVar10->nargs) ||
           (((ulong)hStack_a0.m_ptr & 0xffffffff) + ((long)local_a8 - local_b8._0_8_) * 8 !=
            __new_size)) {
          pybind11_fail(
                       "Internal error: function call dispatcher inserted wrong number of arguments!"
                       );
        }
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ =
             second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ =
             second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
        if (bVar31) {
          std::vector<bool,_std::allocator<bool>_>::resize(&second_pass_convert,__new_size,false);
          puVar7 = local_98;
          hVar4.m_ptr = hStack_a0.m_ptr;
          p_Var18 = local_a8;
          uVar6 = local_b8._8_8_;
          uVar5 = local_b8._0_8_;
          local_188 = local_98;
          oStack_190.super_handle.m_ptr = (handle)(handle)hStack_a0.m_ptr;
          value.m_ptr = (PyObject *)local_b8._0_8_;
          hStack_1a0.m_ptr = (PyObject *)local_b8._8_8_;
          local_98 = second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage;
          local_a8 = second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          hStack_a0.m_ptr =
               (PyObject *)
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_;
          local_b8._0_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          local_b8._8_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = puVar7;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var18;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ = hVar4.m_ptr;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)uVar5;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = uVar6;
        }
        local_120 = (PyObject *)(*pfVar10->impl)((function_call *)&msg);
        bVar22 = local_120 != (PyObject *)0x1;
        if ((bool)(bVar31 & local_120 == (PyObject *)0x1)) {
          uVar25 = (ulong)((byte)pfVar10->field_0x59 >> 5 & 1);
          do {
            bVar22 = false;
            if (uVar24 <= uVar25) goto LAB_0046cab4;
            rVar32 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&second_pass_convert,uVar25);
            puVar7 = local_98;
            hVar4.m_ptr = hStack_a0.m_ptr;
            p_Var18 = local_a8;
            uVar6 = local_b8._8_8_;
            uVar5 = local_b8._0_8_;
            uVar25 = uVar25 + 1;
          } while ((*rVar32._M_p & rVar32._M_mask) == 0);
          local_188 = local_98;
          oStack_190.super_handle.m_ptr = (handle)(handle)hStack_a0.m_ptr;
          value.m_ptr = (PyObject *)local_b8._0_8_;
          hStack_1a0.m_ptr = (PyObject *)local_b8._8_8_;
          local_98 = second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage;
          local_a8 = second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          hStack_a0.m_ptr =
               (PyObject *)
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_;
          local_b8._0_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          local_b8._8_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = puVar7;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var18;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ = hVar4.m_ptr;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)uVar5;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = uVar6;
          std::
          vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          ::emplace_back<pybind11::detail::function_call>(&second_pass,(function_call *)&msg);
          bVar22 = false;
        }
LAB_0046cab4:
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&second_pass_convert.super__Bvector_base<std::allocator<bool>_>);
        pybind11::object::~object(&extra_args.super_object);
      }
      else {
        bVar22 = false;
      }
LAB_0046cad0:
      pybind11::object::~object(&kwargs.super_object);
      detail::function_call::~function_call((function_call *)&msg);
      if (bVar22) break;
    }
  }
  pfVar8 = second_pass.
           super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((bVar31) &&
      (second_pass.
       super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       second_pass.
       super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
       ._M_impl.super__Vector_impl_data._M_finish)) && (local_120 == (PyObject *)0x1)) {
    pfVar26 = second_pass.
              super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while ((local_120 = (PyObject *)0x1, pfVar26 != pfVar8 &&
           (local_120 = (PyObject *)(*pfVar26->func->impl)(pfVar26), local_120 == (PyObject *)0x1)))
    {
      pfVar26 = pfVar26 + 1;
    }
  }
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector(&second_pass);
  if (local_120 == (PyObject *)0x0) {
    std::__cxx11::string::string
              ((string *)&msg,
               "Unable to convert function return value to a Python type! The signature was\n\t",
               (allocator *)&value);
    std::__cxx11::string::append((char *)&msg);
    PyErr_SetString(_PyExc_TypeError,msg._M_dataplus._M_p);
  }
  else {
    if (local_120 != (PyObject *)0x1) {
      if ((local_180->field_0x59 & 1) == 0) {
        return local_120;
      }
      ptVar13 = detail::get_type_info((local_e0.m_ptr)->ob_type);
      (*ptVar13->init_holder)(local_e0.m_ptr,(void *)0x0);
      return local_120;
    }
    if ((local_180->field_0x59 & 4) != 0) {
      __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
      return (PyObject *)&_Py_NotImplementedStruct;
    }
    std::__cxx11::string::string((string *)&kwargs,local_180->name,(allocator *)&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &second_pass_convert,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&kwargs,
                   "(): incompatible ");
    pcVar20 = "function";
    if ((local_180->field_0x59 & 1) != 0) {
      pcVar20 = "constructor";
    }
    std::__cxx11::string::string((string *)&extra_args,pcVar20,(allocator *)&second_pass);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &second_pass_convert,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extra_args)
    ;
    std::operator+(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   " arguments. The following argument types are supported:\n");
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&extra_args);
    std::__cxx11::string::~string((string *)&second_pass_convert);
    std::__cxx11::string::~string((string *)&kwargs);
    __val = 1;
    pfVar10 = local_180;
    while( true ) {
      if (pfVar10 == (function_record *)0x0) break;
      std::__cxx11::to_string((string *)&kwargs,__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &second_pass_convert,"    ",(string *)&kwargs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &second_pass_convert,". ");
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&second_pass_convert);
      std::__cxx11::string::~string((string *)&kwargs);
      if ((local_180->field_0x59 & 1) == 0) {
LAB_0046ce1f:
        std::__cxx11::string::append((char *)&msg);
      }
      else {
        local_178.m_ptr._0_4_ = __val;
        std::__cxx11::string::string
                  ((string *)&value,pfVar10->signature,(allocator *)&second_pass_convert);
        cVar21 = (char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value;
        lVar19 = std::__cxx11::string::find(cVar21,0x28);
        pPVar23 = (PyObject *)(lVar19 + 7);
        if (hStack_1a0.m_ptr <= pPVar23) {
LAB_0046ce00:
          std::__cxx11::string::~string((string *)&value);
          __val = (int)local_178.m_ptr;
          goto LAB_0046ce1f;
        }
        pPVar12 = (PyObject *)std::__cxx11::string::find((char *)&value,0x65525c);
        std::__cxx11::string::rfind((char *)&value,0x61ea1e);
        if (pPVar12 < hStack_1a0.m_ptr) {
          pPVar29 = (PyObject *)((long)&pPVar12->ob_refcnt + 2);
        }
        else {
          pPVar12 = (PyObject *)std::__cxx11::string::find(cVar21,0x29);
          pPVar29 = pPVar12;
        }
        if ((pPVar12 <= pPVar23) || (hStack_1a0.m_ptr <= pPVar29)) goto LAB_0046ce00;
        std::__cxx11::string::append((string *)&msg,(ulong)&value,(ulong)pPVar23);
        std::__cxx11::string::push_back((char)&msg);
        std::__cxx11::string::append((string *)&msg,(ulong)&value,(ulong)pPVar29);
        std::__cxx11::string::~string((string *)&value);
        __val = (int)local_178.m_ptr;
      }
      std::__cxx11::string::append((char *)&msg);
      pfVar10 = pfVar10->next;
      __val = __val + 1;
    }
    std::__cxx11::string::append((char *)&msg);
    args_in->ob_refcnt = args_in->ob_refcnt + 1;
    p_Var18 = (_Bit_type *)(ulong)((byte)local_180->field_0x59 & 1);
    kwargs.super_object.super_handle.m_ptr = (object)(object)args_in;
    while (p_Var14 = (_Bit_type *)PyTuple_Size(kwargs.super_object.super_handle.m_ptr),
          p_Var18 < p_Var14) {
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ =
           kwargs.super_object.super_handle.m_ptr;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var18;
      detail::accessor::operator_cast_to_object((accessor *)&local_50);
      repr((pybind11 *)&extra_args,(handle)local_50._M_dataplus._M_p);
      pybind11::str::operator_cast_to_string((string *)&value,(str *)&extra_args);
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&value);
      pybind11::object::~object((object *)&extra_args);
      pybind11::object::~object((object *)&local_50);
      pybind11::object::~object
                ((object *)
                 &second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
      p_Var14 = (_Bit_type *)PyTuple_Size(kwargs.super_object.super_handle.m_ptr);
      p_Var18 = (_Bit_type *)((long)p_Var18 + 1);
      if (p_Var18 != p_Var14) {
        std::__cxx11::string::append((char *)&msg);
      }
    }
    PyErr_SetString(_PyExc_TypeError,msg._M_dataplus._M_p);
    pybind11::object::~object(&kwargs.super_object);
  }
  std::__cxx11::string::~string((string *)&msg);
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                        *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const size_t n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                function_record &func = *it;
                size_t pos_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --pos_args;   // (but don't count py::args
                if (func.has_kwargs) --pos_args; //  or py::kwargs)

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = std::min(pos_args, n_args_in);
                size_t args_copied = 0;

                // 1. Copy any position arguments given.
                for (; args_copied < args_to_copy; ++args_copied) {
                    // If we find a given positional argument that also has a named kwargs argument,
                    // raise a TypeError like Python does.  (We could also continue with the next
                    // overload, but this seems highly likely to be a caller mistake rather than a
                    // legitimate overload).
                    if (kwargs_in && args_copied < func.args.size() && func.args[args_copied].name) {
                        handle value = PyDict_GetItemString(kwargs_in, func.args[args_copied].name);
                        if (value)
                            throw type_error(std::string(func.name) + "(): got multiple values for argument '" +
                                    std::string(func.args[args_copied].name) + "'");
                    }

                    call.args.push_back(PyTuple_GET_ITEM(args_in, args_copied));
                    call.args_convert.push_back(args_copied < func.args.size() ? func.args[args_copied].convert : true);
                }

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < pos_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < pos_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < pos_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && kwargs.size() > 0 && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                tuple extra_args;
                if (func.has_args) {
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            handle item = PyTuple_GET_ITEM(args_in, args_copied + i);
                            extra_args[i] = item.inc_ref().ptr();
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                        break;
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                msg += pybind11::repr(args_[ti]);
                if ((ti + 1) != args_.size() )
                    msg += ", ";
            }
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor) {
                /* When a constructor ran successfully, the corresponding
                   holder type (e.g. std::unique_ptr) must still be initialized. */
                auto tinfo = get_type_info(Py_TYPE(parent.ptr()));
                tinfo->init_holder(parent.ptr(), nullptr);
            }
            return result.ptr();
        }
    }